

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_getCParams(ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
               unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters *pZVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ZSTD_compressionParameters cPar;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ZSTD_compressionParameters cp;
  
  uVar8 = dictSize + 500 + srcSizeHint;
  if (srcSizeHint != 0) {
    uVar8 = dictSize + srcSizeHint;
  }
  uVar8 = -(ulong)(dictSize + srcSizeHint == 0) | uVar8;
  lVar10 = (ulong)(uVar8 < 0x20001) + (ulong)(uVar8 < 0x40001) + (ulong)(uVar8 < 0x4001);
  iVar7 = 3;
  if (compressionLevel != 0) {
    iVar7 = compressionLevel;
  }
  if (compressionLevel < 0) {
    iVar7 = 0;
  }
  iVar9 = 0x16;
  if (compressionLevel < 0x17) {
    iVar9 = iVar7;
  }
  pZVar1 = ZSTD_defaultCParameters[lVar10] + iVar9;
  uVar2 = pZVar1->searchLog;
  uVar4 = pZVar1->windowLog;
  uVar5 = pZVar1->chainLog;
  uVar6 = pZVar1->hashLog;
  cPar.hashLog = uVar6;
  cPar.chainLog = uVar5;
  cPar.windowLog = uVar4;
  pZVar1 = ZSTD_defaultCParameters[lVar10] + iVar9;
  uVar3 = pZVar1->minMatch;
  cp._20_8_ = *(undefined8 *)(&pZVar1->searchLog + 2);
  if (compressionLevel < 0) {
    cp.targetLength = -compressionLevel;
  }
  cPar.searchLog = uVar2;
  cPar.minMatch = uVar3;
  cPar.targetLength = cp.targetLength;
  cPar.strategy = cp.strategy;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParams(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize)
{
    size_t const addedSize = srcSizeHint ? 0 : 500;
    U64 const rSize = srcSizeHint+dictSize ? srcSizeHint+dictSize+addedSize : (U64)-1;
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);   /* intentional underflow for srcSizeHint == 0 */
    int row = compressionLevel;
    DEBUGLOG(5, "ZSTD_getCParams (cLevel=%i)", compressionLevel);
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        if (compressionLevel < 0) cp.targetLength = (unsigned)(-compressionLevel);   /* acceleration factor */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize);
    }
}